

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void drop_callback(GLFWwindow *window,wchar_t count,char **paths)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  glfwGetTime();
  printf("%08x to %i at %0.3f: Drop input\n",(ulong)uVar2,(ulong)uVar1);
  if (L'\0' < count) {
    uVar4 = 0;
    do {
      printf("  %i: \"%s\"\n",uVar4 & 0xffffffff,paths[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uint)count != uVar4);
  }
  return;
}

Assistant:

static void drop_callback(GLFWwindow* window, int count, const char** paths)
{
    int i;
    Slot* slot = glfwGetWindowUserPointer(window);

    printf("%08x to %i at %0.3f: Drop input\n",
           counter++, slot->number, glfwGetTime());

    for (i = 0;  i < count;  i++)
        printf("  %i: \"%s\"\n", i, paths[i]);
}